

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_sparse_feedback_temporaries
          (CompilerGLSL *this,uint32_t result_type_id,uint32_t id,uint32_t *feedback_id,
          uint32_t *texel_id)

{
  uint32_t uVar1;
  CompilerError *pCVar2;
  size_t sVar3;
  TypedID *pTVar4;
  allocator local_b9;
  string local_b8 [32];
  SPIRType *local_98;
  SPIRType *return_type;
  mapped_type *temps;
  string local_80 [35];
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  uint32_t *local_28;
  uint32_t *texel_id_local;
  uint32_t *feedback_id_local;
  uint32_t id_local;
  uint32_t result_type_id_local;
  CompilerGLSL *this_local;
  
  local_28 = texel_id;
  texel_id_local = feedback_id;
  feedback_id_local._0_4_ = id;
  feedback_id_local._4_4_ = result_type_id;
  _id_local = this;
  if (((this->options).es & 1U) != 0) {
    local_5d = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Sparse texture feedback is not supported on ESSL.",&local_49);
    CompilerError::CompilerError(pCVar2,(string *)local_48);
    local_5d = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_80,"GL_ARB_sparse_texture2",(allocator *)((long)&temps + 7));
  require_extension_internal(this,(string *)local_80);
  ::std::__cxx11::string::~string(local_80);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&temps + 7));
  return_type = (SPIRType *)
                ::std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&this->extra_sub_expressions,(key_type *)&feedback_id_local);
  if (*(mapped_type *)&(return_type->super_IVariant)._vptr_IVariant == 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
    *(uint32_t *)&(return_type->super_IVariant)._vptr_IVariant = uVar1;
  }
  *texel_id_local = *(uint32_t *)&(return_type->super_IVariant)._vptr_IVariant;
  *local_28 = *(int *)&(return_type->super_IVariant)._vptr_IVariant + 1;
  local_98 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,feedback_id_local._4_4_);
  if (*(int *)&(local_98->super_IVariant).field_0xc == 0xf) {
    sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(local_98->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if (sVar3 == 2) {
      pTVar4 = (TypedID *)
               VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         (&(local_98->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,0);
      uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar4);
      emit_uninitialized_temporary(this,uVar1,*texel_id_local);
      pTVar4 = (TypedID *)
               VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         (&(local_98->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,1);
      uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar4);
      emit_uninitialized_temporary(this,uVar1,*local_28);
      return;
    }
  }
  pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"Invalid return type for sparse feedback.",&local_b9);
  CompilerError::CompilerError(pCVar2,(string *)local_b8);
  __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerGLSL::emit_sparse_feedback_temporaries(uint32_t result_type_id, uint32_t id, uint32_t &feedback_id,
                                                    uint32_t &texel_id)
{
	// Need to allocate two temporaries.
	if (options.es)
		SPIRV_CROSS_THROW("Sparse texture feedback is not supported on ESSL.");
	require_extension_internal("GL_ARB_sparse_texture2");

	auto &temps = extra_sub_expressions[id];
	if (temps == 0)
		temps = ir.increase_bound_by(2);

	feedback_id = temps + 0;
	texel_id = temps + 1;

	auto &return_type = get<SPIRType>(result_type_id);
	if (return_type.basetype != SPIRType::Struct || return_type.member_types.size() != 2)
		SPIRV_CROSS_THROW("Invalid return type for sparse feedback.");
	emit_uninitialized_temporary(return_type.member_types[0], feedback_id);
	emit_uninitialized_temporary(return_type.member_types[1], texel_id);
}